

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParsePre(TidyDocImpl *doc,Node *pre,GetTokenMode mode)

{
  Bool BVar1;
  Node *node_00;
  Node *node_01;
  TidyTagId local_3c;
  Node *newnode;
  Node *node;
  Node *pNStack_18;
  GetTokenMode mode_local;
  Node *pre_local;
  TidyDocImpl *doc_local;
  
  if ((pre->tag->model & 1) == 0) {
    prvTidyInlineDup(doc,(Node *)0x0);
    pNStack_18 = pre;
    while (node_00 = prvTidyGetToken(doc,Preformatted), node_00 != (Node *)0x0) {
      if (node_00->type == EndTag) {
        if (node_00->tag != pNStack_18->tag) {
          if ((node_00 == (Node *)0x0) || (node_00->tag == (Dict *)0x0)) {
            local_3c = TidyTag_UNKNOWN;
          }
          else {
            local_3c = node_00->tag->id;
          }
          BVar1 = DescendantOf(pNStack_18,local_3c);
          if (BVar1 == no) goto LAB_001346ec;
        }
        if ((((node_00 == (Node *)0x0) || (node_00->tag == (Dict *)0x0)) ||
            (node_00->tag->id != TidyTag_BODY)) &&
           (((node_00 == (Node *)0x0 || (node_00->tag == (Dict *)0x0)) ||
            (node_00->tag->id != TidyTag_HTML)))) {
          if (node_00->tag == pNStack_18->tag) {
            prvTidyFreeNode(doc,node_00);
          }
          else {
            prvTidyReportError(doc,pNStack_18,node_00,0xcf);
            prvTidyUngetToken(doc);
          }
          pNStack_18->closed = yes;
          TrimSpaces(doc,pNStack_18);
          return;
        }
        prvTidyReportError(doc,pNStack_18,node_00,0xd0);
        prvTidyFreeNode(doc,node_00);
      }
      else {
LAB_001346ec:
        BVar1 = prvTidynodeIsText(node_00);
        if (BVar1 == no) {
          BVar1 = InsertMisc(pNStack_18,node_00);
          if (BVar1 == no) {
            if (node_00->tag == (Dict *)0x0) {
              prvTidyReportError(doc,pNStack_18,node_00,0xd0);
              prvTidyFreeNode(doc,node_00);
            }
            else {
              BVar1 = PreContent(doc,node_00);
              if (BVar1 == no) {
                if (node_00->type == EndTag) {
                  if ((doc->lexer->exiled != no) &&
                     ((BVar1 = prvTidynodeHasCM(node_00,0x80), BVar1 != no ||
                      (((node_00 != (Node *)0x0 && (node_00->tag != (Dict *)0x0)) &&
                       (node_00->tag->id == TidyTag_TABLE)))))) {
                    prvTidyUngetToken(doc);
                    TrimSpaces(doc,pNStack_18);
                    return;
                  }
                  prvTidyReportError(doc,pNStack_18,node_00,0xd0);
                  prvTidyFreeNode(doc,node_00);
                }
                else {
                  BVar1 = prvTidynodeHasCM(node_00,0x280);
                  if ((BVar1 != no) ||
                     (((node_00 != (Node *)0x0 && (node_00->tag != (Dict *)0x0)) &&
                      (node_00->tag->id == TidyTag_TABLE)))) {
                    if (doc->lexer->exiled == no) {
                      prvTidyReportError(doc,pNStack_18,node_00,0xcf);
                    }
                    prvTidyUngetToken(doc);
                    return;
                  }
                  prvTidyInsertNodeAfterElement(pNStack_18,node_00);
                  prvTidyReportError(doc,pNStack_18,node_00,0xcf);
                  ParseTag(doc,node_00,IgnoreWhitespace);
                  node_01 = prvTidyInferredTag(doc,TidyTag_PRE);
                  prvTidyReportError(doc,pNStack_18,node_01,0xd7);
                  prvTidyInsertNodeAfterElement(node_00,node_01);
                  pNStack_18 = node_01;
                }
              }
              else if (((node_00 == (Node *)0x0) || (node_00->tag == (Dict *)0x0)) ||
                      (node_00->tag->id != TidyTag_P)) {
                BVar1 = prvTidynodeIsElement(node_00);
                if (BVar1 == no) {
                  prvTidyReportError(doc,pNStack_18,node_00,0xd0);
                  prvTidyFreeNode(doc,node_00);
                }
                else {
                  if (((node_00 != (Node *)0x0) && (node_00->tag != (Dict *)0x0)) &&
                     (node_00->tag->id == TidyTag_BR)) {
                    TrimSpaces(doc,pNStack_18);
                  }
                  prvTidyInsertNodeAtEnd(pNStack_18,node_00);
                  ParseTag(doc,node_00,Preformatted);
                }
              }
              else if (node_00->type == StartTag) {
                prvTidyReportError(doc,pNStack_18,node_00,0xd6);
                TrimSpaces(doc,pNStack_18);
                prvTidyCoerceNode(doc,node_00,TidyTag_BR,no,no);
                prvTidyFreeAttrs(doc,node_00);
                prvTidyInsertNodeAtEnd(pNStack_18,node_00);
              }
              else {
                prvTidyReportError(doc,pNStack_18,node_00,0xd0);
                prvTidyFreeNode(doc,node_00);
              }
            }
          }
        }
        else {
          prvTidyInsertNodeAtEnd(pNStack_18,node_00);
        }
      }
    }
    prvTidyReportError(doc,pNStack_18,(Node *)0x0,0xce);
  }
  return;
}

Assistant:

void TY_(ParsePre)( TidyDocImpl* doc, Node *pre, GetTokenMode ARG_UNUSED(mode) )
{
    Node *node;

    if (pre->tag->model & CM_EMPTY)
        return;

    TY_(InlineDup)( doc, NULL ); /* tell lexer to insert inlines if needed */

    while ((node = TY_(GetToken)(doc, Preformatted)) != NULL)
    {
        if ( node->type == EndTag && 
             (node->tag == pre->tag || DescendantOf(pre, TagId(node))) )
        {
            if (nodeIsBODY(node) || nodeIsHTML(node))
            {
                TY_(ReportError)(doc, pre, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)(doc, node);
                continue;
            }
            if (node->tag == pre->tag)
            {
                TY_(FreeNode)(doc, node);
            }
            else
            {
                TY_(ReportError)(doc, pre, node, MISSING_ENDTAG_BEFORE );
                TY_(UngetToken)( doc );
            }
            pre->closed = yes;
            TrimSpaces(doc, pre);
            return;
        }

        if (TY_(nodeIsText)(node))
        {
            TY_(InsertNodeAtEnd)(pre, node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(pre, node))
            continue;

        if (node->tag == NULL)
        {
            TY_(ReportError)(doc, pre, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        /* strip unexpected tags */
        if ( !PreContent(doc, node) )
        {
            Node *newnode;

            /* fix for http://tidy.sf.net/bug/772205 */
            if (node->type == EndTag)
            {
                /* http://tidy.sf.net/issue/1590220 */ 
               if ( doc->lexer->exiled
                   && (TY_(nodeHasCM)(node, CM_TABLE) || nodeIsTABLE(node)) )
               {
                  TY_(UngetToken)(doc);
                  TrimSpaces(doc, pre);
                  return;
               }

               TY_(ReportError)(doc, pre, node, DISCARDING_UNEXPECTED);
               TY_(FreeNode)(doc, node);
               continue;
            }
            /* http://tidy.sf.net/issue/1590220 */
            else if (TY_(nodeHasCM)(node, CM_TABLE|CM_ROW)
                     || nodeIsTABLE(node) )
            {
                if (!doc->lexer->exiled)
                    /* No missing close warning if exiled. */
                    TY_(ReportError)(doc, pre, node, MISSING_ENDTAG_BEFORE);

                TY_(UngetToken)(doc);
                return;
            }

            /*
              This is basically what Tidy 04 August 2000 did and far more accurate
              with respect to browser behaivour than the code commented out above.
              Tidy could try to propagate the <pre> into each disallowed child where
              <pre> is allowed in order to replicate some browsers behaivour, but
              there are a lot of exceptions, e.g. Internet Explorer does not propagate
              <pre> into table cells while Mozilla does. Opera 6 never propagates
              <pre> into blocklevel elements while Opera 7 behaves much like Mozilla.

              Tidy behaves thus mostly like Opera 6 except for nested <pre> elements
              which are handled like Mozilla takes them (Opera6 closes all <pre> after
              the first </pre>).

              There are similar issues like replacing <p> in <pre> with <br>, for
              example

                <pre>...<p>...</pre>                 (Input)
                <pre>...<br>...</pre>                (Tidy)
                <pre>...<br>...</pre>                (Opera 7 and Internet Explorer)
                <pre>...<br><br>...</pre>            (Opera 6 and Mozilla)

                <pre>...<p>...</p>...</pre>          (Input)
                <pre>...<br>......</pre>             (Tidy, BUG!)
                <pre>...<br>...<br>...</pre>         (Internet Explorer)
                <pre>...<br><br>...<br><br>...</pre> (Mozilla, Opera 6)
                <pre>...<br>...<br><br>...</pre>     (Opera 7)
                
              or something similar, they could also be closing the <pre> and propagate
              the <pre> into the newly opened <p>.

              Todo: IMG, OBJECT, APPLET, BIG, SMALL, SUB, SUP, FONT, and BASEFONT are
              dissallowed in <pre>, Tidy neither detects this nor does it perform any
              cleanup operation. Tidy should at least issue a warning if it encounters
              such constructs.

              Todo: discarding </p> is abviously a bug, it should be replaced by <br>.
            */
            TY_(InsertNodeAfterElement)(pre, node);
            TY_(ReportError)(doc, pre, node, MISSING_ENDTAG_BEFORE);
            ParseTag(doc, node, IgnoreWhitespace);

            newnode = TY_(InferredTag)(doc, TidyTag_PRE);
            TY_(ReportError)(doc, pre, newnode, INSERTING_TAG);
            pre = newnode;
            TY_(InsertNodeAfterElement)(node, pre);

            continue;
        }

        if ( nodeIsP(node) )
        {
            if (node->type == StartTag)
            {
                TY_(ReportError)(doc, pre, node, USING_BR_INPLACE_OF);

                /* trim white space before <p> in <pre>*/
                TrimSpaces(doc, pre);
            
                /* coerce both <p> and </p> to <br> */
                TY_(CoerceNode)(doc, node, TidyTag_BR, no, no);
                TY_(FreeAttrs)( doc, node ); /* discard align attribute etc. */
                TY_(InsertNodeAtEnd)( pre, node );
            }
            else
            {
                TY_(ReportError)(doc, pre, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            }
            continue;
        }

        if ( TY_(nodeIsElement)(node) )
        {
            /* trim white space before <br> */
            if ( nodeIsBR(node) )
                TrimSpaces(doc, pre);
            
            TY_(InsertNodeAtEnd)(pre, node);
            ParseTag(doc, node, Preformatted);
            continue;
        }

        /* discard unexpected tags */
        TY_(ReportError)(doc, pre, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(ReportError)(doc, pre, node, MISSING_ENDTAG_FOR);
}